

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.c
# Opt level: O0

void nn_fsm_start(nn_fsm *self)

{
  int iVar1;
  undefined8 *in_RDI;
  
  iVar1 = nn_fsm_isidle(self);
  if (iVar1 == 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_fsm_isidle (self)",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/aio/fsm.c"
            ,0x7b);
    fflush(_stderr);
    nn_err_abort();
  }
  (*(code *)*in_RDI)(in_RDI,0xfffffffe,0xfffffffe,0);
  *(undefined4 *)(in_RDI + 2) = 2;
  return;
}

Assistant:

void nn_fsm_start (struct nn_fsm *self)
{
    nn_assert (nn_fsm_isidle (self));
    self->fn (self, NN_FSM_ACTION, NN_FSM_START, NULL);
    self->state = NN_FSM_STATE_ACTIVE;
}